

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall HFSubConsumer::sub_reader(HFSubConsumer *this,zloop_t *loop)

{
  bool bVar1;
  zframe_t *f;
  zframe_t *local_30;
  
  while( true ) {
    bVar1 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                      ((ConcurrentQueue<_zframe_t*,MyTraits> *)&this->framequeue,&this->replacetoken
                       ,&local_30);
    if (!bVar1) break;
    zframe_destroy(&local_30);
    local_30 = (zframe_t *)0x0;
  }
  zloop_reader(loop,(this->super_HighFreqSub).sub,bufferwriter,this);
  zloop_reader(loop,this->rep,requesthandler,this);
  return;
}

Assistant:

void HFSubConsumer::sub_reader(zloop_t *loop){
    zframe_t *f;
    while(framequeue.try_dequeue(replacetoken, f)){
        zframe_destroy(&f);
        f = NULL;
    }
    zloop_reader(loop, sub, bufferwriter, this);
    zloop_reader(loop, rep, requesthandler, this);
}